

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_andnot(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  int iVar3;
  uint8_t uVar4;
  byte bVar5;
  roaring_array_t *ra;
  int *c;
  int *piVar6;
  roaring_bitmap_t *prVar7;
  uint8_t uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ushort uVar17;
  ushort uVar18;
  uint32_t start_index;
  ulong uVar19;
  uint8_t result_type;
  uint8_t local_49;
  uint32_t local_48;
  uint local_44;
  ulong local_40;
  int *local_38;
  
  local_49 = '\0';
  local_48 = (x1->high_low_container).size;
  if (local_48 == 0) {
    bVar5 = 0;
    ra = &roaring_bitmap_create_with_capacity(0)->high_low_container;
    if (((x1->high_low_container).flags & 1) != 0) {
      bVar5 = (x2->high_low_container).flags & 1;
    }
    ra->flags = ra->flags & 0xfe | bVar5;
  }
  else {
    local_44 = (x2->high_low_container).size;
    if (local_44 == 0) {
      prVar7 = roaring_bitmap_copy(x1);
      return prVar7;
    }
    ra = &roaring_bitmap_create_with_capacity(local_48)->high_low_container;
    uVar11 = 0;
    bVar5 = 0;
    if (((x1->high_low_container).flags & 1) != 0) {
      bVar5 = (x2->high_low_container).flags & 1;
    }
    ra->flags = ra->flags & 0xfe | bVar5;
    uVar19 = 0;
LAB_00117930:
    do {
      uVar14 = uVar11 & 0xffff;
      local_40 = uVar11;
      while( true ) {
        puVar1 = (x1->high_low_container).keys;
        uVar11 = uVar19 & 0xffff;
        uVar18 = puVar1[uVar11];
        puVar2 = (x2->high_low_container).keys;
        uVar17 = puVar2[uVar14];
        start_index = (uint32_t)uVar19;
        if (uVar18 == uVar17) break;
        if (uVar17 <= uVar18) {
          uVar13 = (x2->high_low_container).size;
          uVar16 = (int)local_40 + 1;
          uVar9 = uVar16;
          if (((int)uVar13 <= (int)uVar16) || (uVar18 <= puVar2[(int)uVar16])) goto LAB_00117b29;
          uVar9 = (int)local_40 + 2;
          iVar15 = 1;
          if ((int)uVar13 <= (int)uVar9) goto LAB_00117b0e;
          iVar15 = 1;
          goto LAB_00117af1;
        }
        uVar13 = (x1->high_low_container).size;
        uVar16 = start_index + 1;
        uVar9 = uVar16;
        if (((int)uVar16 < (int)uVar13) && (puVar1[(int)uVar16] < uVar17)) {
          uVar9 = start_index + 2;
          iVar15 = 1;
          if ((int)uVar9 < (int)uVar13) {
            iVar15 = 1;
            do {
              uVar11 = (ulong)uVar9;
              uVar18 = puVar1[(int)uVar9];
              if (uVar17 <= uVar18) goto LAB_001179b6;
              iVar3 = iVar15 * 2;
              uVar9 = uVar16 + iVar15 * 2;
              iVar15 = iVar3;
            } while ((int)uVar9 < (int)uVar13);
          }
          uVar18 = puVar1[(long)(int)uVar13 + -1];
          uVar11 = (long)(int)uVar13 - 1;
LAB_001179b6:
          uVar10 = (uint)uVar11;
          uVar9 = uVar10;
          if (((uVar18 != uVar17) && (uVar9 = uVar13, uVar17 <= uVar18)) &&
             (uVar9 = uVar10, (iVar15 >> 1) + uVar16 + 1 != uVar10)) {
            uVar16 = (iVar15 >> 1) + uVar16;
            do {
              uVar9 = (int)(uVar16 + (uint)uVar11) >> 1;
              if (puVar1[(int)uVar9] == uVar17) break;
              uVar13 = uVar9;
              if (puVar1[(int)uVar9] < uVar17) {
                uVar13 = (uint)uVar11;
                uVar16 = uVar9;
              }
              uVar11 = (ulong)uVar13;
              uVar9 = uVar13;
            } while (uVar16 + 1 != uVar13);
          }
        }
        ra_append_copy_range
                  (ra,&x1->high_low_container,start_index,uVar9,
                   (_Bool)((x1->high_low_container).flags & 1));
        uVar19 = (ulong)uVar9;
        if (uVar9 == local_48) {
          uVar13 = (uint)local_40;
          start_index = local_48;
          goto LAB_00117c0e;
        }
      }
      c = (int *)container_andnot((x1->high_low_container).containers[uVar11],
                                  (x1->high_low_container).typecodes[uVar11],
                                  (x2->high_low_container).containers[uVar14],
                                  (x2->high_low_container).typecodes[uVar14],&local_49);
      uVar4 = local_49;
      piVar6 = c;
      uVar8 = local_49;
      if (local_49 == '\x04') {
        uVar8 = (uint8_t)c[2];
        if (uVar8 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        piVar6 = *(int **)c;
      }
      if ((uVar8 == '\x03') || (uVar8 == '\x02')) {
        if (*piVar6 < 1) goto LAB_00117b76;
LAB_00117b3f:
        local_38 = c;
        extend_array(ra,1);
        iVar15 = ra->size;
        ra->keys[iVar15] = uVar18;
        ra->containers[iVar15] = local_38;
        ra->typecodes[iVar15] = uVar4;
        ra->size = ra->size + 1;
      }
      else {
        if (uVar8 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x11c6,"_Bool container_nonzero_cardinality(const container_t *, uint8_t)")
          ;
        }
        if (*piVar6 != 0) {
          if (*piVar6 != -1) goto LAB_00117b3f;
          lVar12 = 0;
          do {
            if (*(long *)(*(long *)(piVar6 + 2) + lVar12 * 8) != 0) goto LAB_00117b3f;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x400);
        }
LAB_00117b76:
        container_free(c,local_49);
      }
      start_index = start_index + 1;
      uVar19 = (ulong)start_index;
      uVar13 = (int)local_40 + 1;
      uVar11 = (ulong)uVar13;
    } while ((start_index != local_48) && (uVar13 != local_44));
LAB_00117c0e:
    if (uVar13 == local_44) {
LAB_00117c14:
      ra_append_copy_range
                (ra,&x1->high_low_container,start_index,local_48,
                 (_Bool)((x1->high_low_container).flags & 1));
    }
  }
  return (roaring_bitmap_t *)ra;
  while( true ) {
    iVar3 = iVar15 * 2;
    uVar9 = uVar16 + iVar15 * 2;
    iVar15 = iVar3;
    if ((int)uVar13 <= (int)uVar9) break;
LAB_00117af1:
    uVar11 = (ulong)uVar9;
    uVar17 = puVar2[(int)uVar9];
    if (uVar18 <= uVar17) goto LAB_00117b1c;
  }
LAB_00117b0e:
  uVar17 = puVar2[(long)(int)uVar13 + -1];
  uVar11 = (long)(int)uVar13 - 1;
LAB_00117b1c:
  uVar10 = (uint)uVar11;
  uVar9 = uVar10;
  if (((uVar17 != uVar18) && (uVar9 = uVar13, uVar18 <= uVar17)) &&
     (uVar9 = uVar10, (iVar15 >> 1) + uVar16 + 1 != uVar10)) {
    uVar16 = (iVar15 >> 1) + uVar16;
    do {
      uVar9 = (int)(uVar16 + (uint)uVar11) >> 1;
      if (puVar2[(int)uVar9] == uVar18) break;
      uVar13 = uVar9;
      if (puVar2[(int)uVar9] < uVar18) {
        uVar13 = (uint)uVar11;
        uVar16 = uVar9;
      }
      uVar11 = (ulong)uVar13;
      uVar9 = uVar13;
    } while (uVar16 + 1 != uVar13);
  }
LAB_00117b29:
  uVar11 = (ulong)uVar9;
  if (uVar9 == local_44) goto LAB_00117c14;
  goto LAB_00117930;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_andnot(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        roaring_bitmap_t *empty_bitmap = roaring_bitmap_create();
        roaring_bitmap_set_copy_on_write(empty_bitmap, is_cow(x1) && is_cow(x2));
        return empty_bitmap;
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(length1);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = 0;
    uint16_t s2 = 0;
    while (true) {
        s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_andnot(c1, type1, c2, type2,
                                              &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
        } else if (s1 < s2) {  // s1 < s2
            const int next_pos1 =
                ra_advance_until(&x1->high_low_container, s2, pos1);
            ra_append_copy_range(&answer->high_low_container,
                                 &x1->high_low_container, pos1, next_pos1,
                                 is_cow(x1));
            // TODO : perhaps some of the copy_on_write should be based on
            // answer rather than x1 (more stringent?).  Many similar cases
            pos1 = next_pos1;
            if (pos1 == length1) break;
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
        }
    }
    if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}